

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

Cut_Man_t * Abc_NtkCuts(Abc_Ntk_t *pNtk,Cut_Params_t *pParams)

{
  FILE *pFile;
  int iVar1;
  abctime aVar2;
  Cut_Man_t *p_00;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *p_01;
  ProgressBar *p_02;
  uint *puTruth;
  abctime aVar4;
  Cut_Cut_t *local_68;
  Cut_Cut_t *pCut;
  abctime clk;
  int i;
  Vec_Int_t *vChoices;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pObj;
  Cut_Cut_t *pList;
  Cut_Man_t *p;
  ProgressBar *pProgress;
  Cut_Params_t *pParams_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar2 = Abc_Clock();
  if (pParams->fAdjust != 0) {
    Abc_NtkCutsSubtractFanunt(pNtk);
  }
  nEqual = 0;
  nGood = 0;
  nTotal = 0;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    pParams->nIdsMax = iVar1;
    p_00 = Cut_ManStart(pParams);
    if ((pParams->fGlobal != 0) || (pParams->fLocal != 0)) {
      pVVar3 = Abc_NtkGetNodeAttributes(pNtk);
      Cut_ManSetNodeAttrs(p_00,pVVar3);
    }
    if (pParams->fDrop != 0) {
      pVVar3 = Abc_NtkFanoutCounts(pNtk);
      Cut_ManSetFanoutCounts(p_00,pVVar3);
    }
    for (clk._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
      pObj_00 = Abc_NtkCi(pNtk,clk._4_4_);
      iVar1 = Abc_ObjFanoutNum(pObj_00);
      if (0 < iVar1) {
        Cut_NodeSetTriv(p_00,pObj_00->Id);
      }
    }
    p_01 = Abc_AigDfs(pNtk,0,1);
    pVVar3 = Vec_IntAlloc(100);
    pFile = _stdout;
    iVar1 = Vec_PtrSize(p_01);
    p_02 = Extra_ProgressBarStart(pFile,iVar1);
    for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p_01), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
      vNodes = (Vec_Ptr_t *)Vec_PtrEntry(p_01,clk._4_4_);
      iVar1 = Abc_ObjIsCo((Abc_Obj_t *)vNodes);
      if (iVar1 == 0) {
        Extra_ProgressBarUpdate(p_02,clk._4_4_,(char *)0x0);
        local_68 = (Cut_Cut_t *)
                   Abc_NodeGetCuts(p_00,(Abc_Obj_t *)vNodes,pParams->fDag,pParams->fTree);
        if ((pParams->fNpnSave != 0) && (local_68 != (Cut_Cut_t *)0x0)) {
          for (; local_68 != (Cut_Cut_t *)0x0; local_68 = local_68->pNext) {
            if (3 < *(uint *)local_68 >> 0x1c) {
              puTruth = Cut_CutReadTruth(local_68);
              Npn_ManSaveOne(puTruth,*(uint *)local_68 >> 0x1c);
            }
          }
        }
        if (pParams->fDrop != 0) {
          iVar1 = Abc_ObjFaninId0((Abc_Obj_t *)vNodes);
          Cut_NodeTryDroppingCuts(p_00,iVar1);
          iVar1 = Abc_ObjFaninId1((Abc_Obj_t *)vNodes);
          Cut_NodeTryDroppingCuts(p_00,iVar1);
        }
        iVar1 = Abc_AigNodeIsChoice((Abc_Obj_t *)vNodes);
        if (iVar1 != 0) {
          Vec_IntClear(pVVar3);
          for (; vNodes != (Vec_Ptr_t *)0x0; vNodes = (Vec_Ptr_t *)vNodes[3].pArray) {
            Vec_IntPush(pVVar3,vNodes[1].nCap);
          }
          Cut_NodeUnionCuts(p_00,pVVar3);
        }
      }
      else if (pParams->fDrop != 0) {
        iVar1 = Abc_ObjFaninId0((Abc_Obj_t *)vNodes);
        Cut_NodeTryDroppingCuts(p_00,iVar1);
      }
    }
    Extra_ProgressBarStop(p_02);
    Vec_PtrFree(p_01);
    Vec_IntFree(pVVar3);
    Cut_ManPrintStats(p_00);
    Abc_Print(1,"%s =","TOTAL");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
    if (nTotal != 0) {
      printf("Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n",(double)nGood / (double)nTotal,
             (ulong)(uint)nTotal,(ulong)(uint)nGood);
    }
    if (pParams->fAdjust != 0) {
      Abc_NtkCutsAddFanunt(pNtk);
    }
    return p_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                ,0x8d,"Cut_Man_t *Abc_NtkCuts(Abc_Ntk_t *, Cut_Params_t *)");
}

Assistant:

Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams )
{
    ProgressBar * pProgress;
    Cut_Man_t * p;
    Cut_Cut_t * pList;
    Abc_Obj_t * pObj, * pNode;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vChoices;
    int i;
    abctime clk = Abc_Clock();

    extern void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk );
    extern void Abc_NtkBalanceDetach( Abc_Ntk_t * pNtk );

    if ( pParams->fAdjust )
    Abc_NtkCutsSubtractFanunt( pNtk );

    nTotal = nGood = nEqual = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the manager
    pParams->nIdsMax = Abc_NtkObjNumMax( pNtk );
    p = Cut_ManStart( pParams );
    // compute node attributes if local or global cuts are requested
    if ( pParams->fGlobal || pParams->fLocal )
    {
        extern Vec_Int_t * Abc_NtkGetNodeAttributes( Abc_Ntk_t * pNtk );
        Cut_ManSetNodeAttrs( p, Abc_NtkGetNodeAttributes(pNtk) );
    }
    // prepare for cut dropping
    if ( pParams->fDrop )
        Cut_ManSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );
    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_NodeSetTriv( p, pObj->Id );
    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    vChoices = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vNodes) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( pParams->fDrop )
                Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // compute the cuts to the internal node
        pList = (Cut_Cut_t *)Abc_NodeGetCuts( p, pObj, pParams->fDag, pParams->fTree );
        if ( pParams->fNpnSave && pList )
        {
            extern void Npn_ManSaveOne( unsigned * puTruth, int nVars );
            Cut_Cut_t * pCut;
            for ( pCut = pList; pCut; pCut = pCut->pNext )
                if ( pCut->nLeaves >= 4 )
                    Npn_ManSaveOne( Cut_CutReadTruth(pCut), pCut->nLeaves );
        }
        // consider dropping the fanins cuts
        if ( pParams->fDrop )
        {
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
        // add cuts due to choices
        if ( Abc_AigNodeIsChoice(pObj) )
        {
            Vec_IntClear( vChoices );
            for ( pNode = pObj; pNode; pNode = (Abc_Obj_t *)pNode->pData )
                Vec_IntPush( vChoices, pNode->Id );
            Cut_NodeUnionCuts( p, vChoices );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vChoices );
    Cut_ManPrintStats( p );
ABC_PRT( "TOTAL", Abc_Clock() - clk );
//    printf( "Area = %d.\n", Abc_NtkComputeArea( pNtk, p ) );
//Abc_NtkPrintCuts( p, pNtk, 0 );
//    Cut_ManPrintStatsToFile( p, pNtk->pSpec, Abc_Clock() - clk );

    // temporary printout of stats
    if ( nTotal )
    printf( "Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n", nTotal, nGood, ((double)nGood)/nTotal );
    if ( pParams->fAdjust )
    Abc_NtkCutsAddFanunt( pNtk );
    return p;
}